

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void TM8uv_SSE2(uint8_t *dst)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  long lVar14;
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar16 [16];
  short sVar23;
  
  uVar1 = *(ulong *)(dst + -0x20);
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = (char)(uVar1 >> 8);
  lVar14 = 0;
  do {
    auVar16 = pshuflw(ZEXT416((uint)dst[lVar14 + -1] - (uint)dst[-0x21]),
                      ZEXT416((uint)dst[lVar14 + -1] - (uint)dst[-0x21]),0);
    sVar22 = auVar16._0_2_;
    sVar15 = sVar22 + (ushort)(byte)uVar1;
    sVar23 = auVar16._2_2_;
    sVar17 = sVar23 + auVar11._0_2_;
    sVar18 = sVar22 + auVar10._0_2_;
    sVar19 = sVar23 + (short)Var9;
    sVar20 = sVar22 + auVar7._8_2_;
    sVar21 = sVar23 + auVar5._10_2_;
    sVar22 = sVar22 + auVar3._12_2_;
    sVar23 = sVar23 + (auVar2._13_2_ >> 8);
    *(ulong *)(dst + lVar14) =
         CONCAT17((0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23),
                  CONCAT16((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22),
                           CONCAT15((0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21)
                                    ,CONCAT14((0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 -
                                              (0xff < sVar20),
                                              CONCAT13((0 < sVar19) * (sVar19 < 0x100) *
                                                       (char)sVar19 - (0xff < sVar19),
                                                       CONCAT12((0 < sVar18) * (sVar18 < 0x100) *
                                                                (char)sVar18 - (0xff < sVar18),
                                                                CONCAT11((0 < sVar17) *
                                                                         (sVar17 < 0x100) *
                                                                         (char)sVar17 -
                                                                         (0xff < sVar17),
                                                                         (0 < sVar15) *
                                                                         (sVar15 < 0x100) *
                                                                         (char)sVar15 -
                                                                         (0xff < sVar15))))))));
    lVar14 = lVar14 + 0x20;
  } while ((int)lVar14 != 0x100);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const __m128i zero = _mm_setzero_si128();
  int y;
  if (size == 4) {
    const __m128i top_values = _mm_cvtsi32_si128(WebPMemToInt32(top));
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 4; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      WebPInt32ToMem(dst, _mm_cvtsi128_si32(out));
    }
  } else if (size == 8) {
    const __m128i top_values = _mm_loadl_epi64((const __m128i*)top);
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 8; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      _mm_storel_epi64((__m128i*)dst, out);
    }
  } else {
    const __m128i top_values = _mm_loadu_si128((const __m128i*)top);
    const __m128i top_base_0 = _mm_unpacklo_epi8(top_values, zero);
    const __m128i top_base_1 = _mm_unpackhi_epi8(top_values, zero);
    for (y = 0; y < 16; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out_0 = _mm_add_epi16(base, top_base_0);
      const __m128i out_1 = _mm_add_epi16(base, top_base_1);
      const __m128i out = _mm_packus_epi16(out_0, out_1);
      _mm_storeu_si128((__m128i*)dst, out);
    }
  }
}